

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetMessageEntity(TgTypeParser *this,ptree *data)

{
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pbVar1;
  int iVar2;
  element_type *peVar3;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar4;
  allocator local_1b1;
  string local_1b0 [32];
  shared_ptr<TgBot::User> local_190;
  allocator local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  type local_120;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_21;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  ptree *data_local;
  TgTypeParser *this_local;
  shared_ptr<TgBot::MessageEntity> *result;
  
  local_21 = 0;
  local_20 = in_RDX;
  data_local = data;
  this_local = this;
  std::make_shared<TgBot::MessageEntity>();
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_78,"type",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&local_48,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)pbVar1,&local_78);
  peVar3 = std::__shared_ptr_access<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::__cxx11::string::operator=((string *)peVar3,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_78);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_c0,"offset",0x2e);
  iVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(pbVar1,&local_c0);
  peVar3 = std::__shared_ptr_access<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  peVar3->offset = iVar2;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_c0);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_f8,"length",0x2e);
  iVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(pbVar1,&local_f8);
  peVar3 = std::__shared_ptr_access<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  peVar3->length = iVar2;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_f8);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_150,"url",0x2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"",&local_179);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&local_120,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)local_20,&local_150,&local_178);
  peVar3 = std::__shared_ptr_access<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::__cxx11::string::operator=((string *)&peVar3->url,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"user",&local_1b1);
  tryParseJson<TgBot::User>
            ((TgTypeParser *)&local_190,(JsonToTgTypeFunc<TgBot::User>)data,
             (ptree *)parseJsonAndGetUser,(string *)0x0);
  peVar3 = std::__shared_ptr_access<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::shared_ptr<TgBot::User>::operator=(&peVar3->user,&local_190);
  std::shared_ptr<TgBot::User>::~shared_ptr(&local_190);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  PVar4.super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar4.super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar4.super___shared_ptr<TgBot::MessageEntity,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MessageEntity::Ptr TgTypeParser::parseJsonAndGetMessageEntity(const ptree& data) const{
    auto result(make_shared<MessageEntity>());
    result->type = data.get<string>("type");
    result->offset = data.get<int32_t>("offset");
    result->length = data.get<int32_t>("length");
    result->url = data.get<string>("url", "");
    result->user = tryParseJson<User>(&TgTypeParser::parseJsonAndGetUser, data, "user");
    return result;
}